

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O2

bool __thiscall TxOrphanage::AddTx(TxOrphanage *this,CTransactionRef *tx,NodeId peer)

{
  Wtxid *this_00;
  element_type *peVar1;
  pointer pCVar2;
  string_view source_file;
  string_view source_file_00;
  bool bVar3;
  size_type sVar4;
  size_t sVar5;
  size_t sVar6;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar7;
  _Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
  *this_01;
  Logger *pLVar8;
  Level level;
  Wtxid *pWVar9;
  value_type *pvVar10;
  string *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Txid *this_02;
  CTxIn *txin;
  pointer __k;
  long in_FS_OFFSET;
  bool bVar11;
  string_view str;
  string_view str_00;
  pair<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_bool>
  pVar12;
  string_view logging_function;
  string_view logging_function_00;
  unsigned_long *in_stack_fffffffffffffe90;
  size_t local_148;
  size_t local_140;
  uint sz;
  value_type local_130;
  undefined1 local_128 [8];
  string log_msg;
  string local_f8;
  string local_d8 [4];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = &peVar1->m_witness_hash;
  pWVar9 = this_00;
  sVar4 = std::
          map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
          ::count(&this->m_orphans,this_00);
  level = (Level)pWVar9;
  if (sVar4 != 0) {
    bVar11 = false;
    goto LAB_003501f1;
  }
  this_02 = &peVar1->hash;
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  log_msg._M_dataplus._M_p = "";
  log_msg._M_string_length = (size_type)peVar1;
  sVar5 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&log_msg);
  t = &local_58;
  local_58._M_dataplus._M_p = &::TX_WITH_WITNESS.allow_witness;
  local_58._M_string_length = (size_type)peVar1;
  sVar6 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)t);
  sz = (int)sVar6 + (int)sVar5 * 3;
  bVar11 = sz < 0x61a81;
  if (bVar11) {
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&log_msg,
               &tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
    log_msg.field_2._M_allocated_capacity = peer;
    tVar7 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    log_msg.field_2._8_8_ = (long)tVar7.__d.__r + 0x4b0;
    pVar12 = std::
             _Rb_tree<transaction_identifier<true>,std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>,std::_Select1st<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
             ::_M_emplace_unique<transaction_identifier<true>const&,TxOrphanage::OrphanTx>
                       ((_Rb_tree<transaction_identifier<true>,std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>,std::_Select1st<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
                         *)this,this_00,(OrphanTx *)&log_msg);
    local_130._M_node = (_Base_ptr)pVar12.first._M_node;
    local_128[0] = pVar12.second;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&log_msg._M_string_length);
    if (local_128[0] == '\0') {
      __assert_fail("ret.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txorphanage.cpp"
                    ,0x25,"bool TxOrphanage::AddTx(const CTransactionRef &, NodeId)");
    }
    this_01 = (_Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
               *)&this->m_orphan_list;
    pvVar10 = &local_130;
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
    ::push_back((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                 *)this_01,&local_130);
    peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__k = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start; __k != pCVar2; __k = __k + 1) {
      this_01 = (_Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
                 *)std::
                   map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                   ::operator[](&this->m_outpoint_to_orphan_it,&__k->prevout);
      pvVar10 = &local_130;
      std::
      _Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
      ::
      _M_insert_unique<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const&>
                (this_01,&local_130);
    }
    bVar3 = ::LogAcceptCategory((LogFlags)this_01,(Level)pvVar10);
    if (!bVar3) goto LAB_003501f1;
    base_blob<256u>::ToString_abi_cxx11_(local_d8,(base_blob<256u> *)this_02);
    base_blob<256u>::ToString_abi_cxx11_(&local_f8,(base_blob<256u> *)this_00);
    local_140 = (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_148 = (this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pLVar8 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar8);
    if (bVar3) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_allocated_capacity =
           log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      tinyformat::
      format<std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long>
                (&local_58,
                 (tinyformat *)"stored orphan tx %s (wtxid=%s), weight: %u (mapsz %u outsz %u)\n",
                 (char *)local_d8,&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sz,
                 (uint *)&local_140,&local_148,in_stack_fffffffffffffe90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      pLVar8 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x58;
      local_58._M_string_length = 0x6d6ee6;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file_00._M_len = 0x58;
      str_00._M_str = log_msg._M_dataplus._M_p;
      str_00._M_len = log_msg._M_string_length;
      logging_function_00._M_str = "AddTx";
      logging_function_00._M_len = 5;
      BCLog::Logger::LogPrintStr
                (pLVar8,str_00,logging_function_00,source_file_00,0x2c,TXPACKAGES,Debug);
LAB_003501cd:
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  else {
    bVar3 = ::LogAcceptCategory((LogFlags)t,level);
    if (!bVar3) goto LAB_003501f1;
    base_blob<256u>::ToString_abi_cxx11_(local_d8,(base_blob<256u> *)this_02);
    base_blob<256u>::ToString_abi_cxx11_(&local_f8,(base_blob<256u> *)this_00);
    pLVar8 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar8);
    if (bVar3) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_allocated_capacity =
           log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      tinyformat::format<unsigned_int,std::__cxx11::string,std::__cxx11::string>
                (&local_58,
                 (tinyformat *)"ignoring large orphan tx (size: %u, txid: %s, wtxid: %s)\n",
                 (char *)&sz,(uint *)local_d8,&local_f8,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      pLVar8 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x58;
      local_58._M_string_length = 0x6d6ee6;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "AddTx";
      logging_function._M_len = 5;
      BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x20,TXPACKAGES,Debug);
      goto LAB_003501cd;
    }
  }
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_d8);
LAB_003501f1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool TxOrphanage::AddTx(const CTransactionRef& tx, NodeId peer)
{
    const Txid& hash = tx->GetHash();
    const Wtxid& wtxid = tx->GetWitnessHash();
    if (m_orphans.count(wtxid))
        return false;

    // Ignore big transactions, to avoid a
    // send-big-orphans memory exhaustion attack. If a peer has a legitimate
    // large transaction with a missing parent then we assume
    // it will rebroadcast it later, after the parent transaction(s)
    // have been mined or received.
    // 100 orphans, each of which is at most 100,000 bytes big is
    // at most 10 megabytes of orphans and somewhat more byprev index (in the worst case):
    unsigned int sz = GetTransactionWeight(*tx);
    if (sz > MAX_STANDARD_TX_WEIGHT)
    {
        LogDebug(BCLog::TXPACKAGES, "ignoring large orphan tx (size: %u, txid: %s, wtxid: %s)\n", sz, hash.ToString(), wtxid.ToString());
        return false;
    }

    auto ret = m_orphans.emplace(wtxid, OrphanTx{tx, peer, Now<NodeSeconds>() + ORPHAN_TX_EXPIRE_TIME, m_orphan_list.size()});
    assert(ret.second);
    m_orphan_list.push_back(ret.first);
    for (const CTxIn& txin : tx->vin) {
        m_outpoint_to_orphan_it[txin.prevout].insert(ret.first);
    }

    LogDebug(BCLog::TXPACKAGES, "stored orphan tx %s (wtxid=%s), weight: %u (mapsz %u outsz %u)\n", hash.ToString(), wtxid.ToString(), sz,
             m_orphans.size(), m_outpoint_to_orphan_it.size());
    return true;
}